

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QRect __thiscall QMainWindowLayoutState::gapRect(QMainWindowLayoutState *this,QList<int> *path)

{
  int iVar1;
  Data *pDVar2;
  CutResult CVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QRect QVar6;
  QRect QVar7;
  QArrayData *d;
  qsizetype p;
  QList<int> local_68;
  qsizetype local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0xffffffff00000000;
  iVar1 = *(path->d).ptr;
  if (iVar1 == 1) {
    local_40 = 1;
    local_48 = -1;
    CVar3 = QtPrivate::QContainerImplHelper::mid((path->d).size,&local_40,&local_48);
    if (CVar3 < Full) {
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (int *)0x0;
      local_68.d.size = 0;
    }
    else if (CVar3 == Full) {
      local_68.d.d = (path->d).d;
      local_68.d.ptr = (path->d).ptr;
      local_68.d.size = (path->d).size;
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr =
           (int *)QArrayData::allocate((QArrayData **)&local_68,4,0x10,local_48,KeepSize);
      local_68.d.size = local_48;
      pDVar2 = local_68.d.d;
      if (local_48 != 0) {
        memcpy(local_68.d.ptr,(path->d).ptr + local_40,local_48 * 4);
      }
      local_68.d.d = pDVar2;
      if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,4,0x10);
        }
      }
    }
    QVar6 = QDockAreaLayout::gapRect(&this->dockAreaLayout,&local_68);
  }
  else {
    if (iVar1 != 0) {
      uVar4 = 0;
      QVar6 = (QRect)(ZEXT816(0xffffffff) << 0x40);
      goto LAB_00430e2f;
    }
    local_40 = 1;
    local_48 = -1;
    CVar3 = QtPrivate::QContainerImplHelper::mid((path->d).size,&local_40,&local_48);
    if (CVar3 < Full) {
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (int *)0x0;
      local_68.d.size = 0;
    }
    else if (CVar3 == Full) {
      local_68.d.d = (path->d).d;
      local_68.d.ptr = (path->d).ptr;
      local_68.d.size = (path->d).size;
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr =
           (int *)QArrayData::allocate((QArrayData **)&local_68,4,0x10,local_48,KeepSize);
      local_68.d.size = local_48;
      pDVar2 = local_68.d.d;
      if (local_48 != 0) {
        memcpy(local_68.d.ptr,(path->d).ptr + local_40,local_48 * 4);
      }
      local_68.d.d = pDVar2;
      if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,4,0x10);
        }
      }
    }
    QVar6 = QToolBarAreaLayout::itemRect(&this->toolBarAreaLayout,&local_68);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,4,0x10);
    }
  }
  uVar4 = QVar6._0_8_ & 0xffffffff00000000;
  uVar5 = QVar6._8_8_ & 0xffffffff00000000;
LAB_00430e2f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar7._0_8_ = QVar6._0_8_ & 0xffffffff | uVar4;
    QVar7._8_8_ = QVar6._8_8_ & 0xffffffff | uVar5;
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QRect QMainWindowLayoutState::gapRect(const QList<int> &path) const
{
    int i = path.first();

#if QT_CONFIG(toolbar)
    if (i == 0)
        return toolBarAreaLayout.itemRect(path.mid(1));
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        return dockAreaLayout.gapRect(path.mid(1));
#endif // QT_CONFIG(dockwidget)

    return QRect();
}